

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otfcc-q2c.cpp
# Opt level: O0

string * GetName(string *__return_storage_ptr__,NameId id,json *name)

{
  bool bVar1;
  reference this;
  const_reference pvVar2;
  json *entry;
  const_iterator __end1;
  const_iterator __begin1;
  json *__range1;
  json *name_local;
  NameId id_local;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((const_iterator *)&__end1.m_it.primitive_iterator,name);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((const_iterator *)&entry,name);
  do {
    bVar1 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&__end1.m_it.primitive_iterator,
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&entry);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&__end1.m_it.primitive_iterator);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)this,"nameID");
    bVar1 = nlohmann::operator==<NameId,_0>(pvVar2,id);
    if (bVar1) {
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)this,"platformID");
      bVar1 = nlohmann::operator==<int,_0>(pvVar2,3);
      if (bVar1) {
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)this,"encodingID");
        bVar1 = nlohmann::operator==<int,_0>(pvVar2,1);
        if (!bVar1) {
          pvVar2 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)this,"encodingID");
          bVar1 = nlohmann::operator==<int,_0>(pvVar2,10);
          if (!bVar1) goto LAB_001048a7;
        }
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)this,"languageID");
        bVar1 = nlohmann::operator==<int,_0>(pvVar2,0x409);
        if (bVar1) {
          pvVar2 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)this,"nameString");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,pvVar2);
          return __return_storage_ptr__;
        }
      }
    }
LAB_001048a7:
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)&__end1.m_it.primitive_iterator);
  } while( true );
}

Assistant:

string GetName(NameId id, const json &name)
{
	for (const json &entry : name)
	{
		// Windows, Unicode, English
		if (entry["nameID"] == id && entry["platformID"] == 3 &&
		    (entry["encodingID"] == 1 || entry["encodingID"] == 10) &&
		    entry["languageID"] == 1033)
			return entry["nameString"];
	}
	return {};
}